

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmulNet.cpp
# Opt level: O1

int __thiscall
EmulNet::ENrecv(EmulNet *this,Address *myaddr,_func_int_void_ptr_char_ptr_int *enq,timeval *t,
               int times,void *queue)

{
  int *piVar1;
  en_msg *__ptr;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *__dest;
  long lVar5;
  
  lVar5 = (long)(this->emulnet).currbuffsize;
  if (0 < lVar5) {
    do {
      __ptr = (this->emulnet).buff[lVar5 + -1];
      iVar3 = strcmp((__ptr->to).addr,myaddr->addr);
      if (iVar3 == 0) {
        iVar3 = __ptr->size;
        __dest = (char *)malloc((long)iVar3);
        memcpy(__dest,__ptr + 1,(long)iVar3);
        iVar4 = (this->emulnet).currbuffsize;
        (this->emulnet).buff[lVar5 + -1] = (this->emulnet).buff[(long)iVar4 + -1];
        (this->emulnet).currbuffsize = iVar4 + -1;
        (*enq)(queue,__dest,iVar3);
        free(__ptr);
        iVar3 = *(int *)myaddr->addr;
        iVar4 = Params::getcurrtime(this->par);
        if (1000 < (long)iVar3) {
          __assert_fail("dst <= MAX_NODES",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/justintumale[P]membership_protocol/mp1/EmulNet.cpp"
                        ,0xa9,
                        "int EmulNet::ENrecv(Address *, int (*)(void *, char *, int), struct timeval *, int, void *)"
                       );
        }
        if (0xe0f < iVar4) {
          __assert_fail("time < MAX_TIME",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/justintumale[P]membership_protocol/mp1/EmulNet.cpp"
                        ,0xaa,
                        "int EmulNet::ENrecv(Address *, int (*)(void *, char *, int), struct timeval *, int, void *)"
                       );
        }
        piVar1 = this->recv_msgs[iVar3] + iVar4;
        *piVar1 = *piVar1 + 1;
      }
      bVar2 = 1 < lVar5;
      lVar5 = lVar5 + -1;
    } while (bVar2);
  }
  return 0;
}

Assistant:

int EmulNet::ENrecv(Address *myaddr, int (* enq)(void *, char *, int), struct timeval *t, int times, void *queue){
	// times is always assumed to be 1
	int i;
	char* tmp;
	int sz;
	en_msg *emsg;

	for( i = emulnet.currbuffsize - 1; i >= 0; i-- ) {
		emsg = emulnet.buff[i];

		if ( 0 == strcmp(emsg->to.addr, myaddr->addr) ) {
			sz = emsg->size;
			tmp = (char *) malloc(sz * sizeof(char));
			memcpy(tmp, (char *)(emsg+1), sz);

			emulnet.buff[i] = emulnet.buff[emulnet.currbuffsize-1];
			emulnet.currbuffsize--;

			(*enq)(queue, (char *)tmp, sz);

			free(emsg);

			int dst = *(int *)(myaddr->addr);
			int time = par->getcurrtime();

			assert(dst <= MAX_NODES);
			assert(time < MAX_TIME);

			recv_msgs[dst][time]++;
		}
	}

	return 0;
}